

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O0

string * __thiscall
t_d_generator::render_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_d_generator *this,t_type *ttype,bool isArg)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  t_type *ptVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 auVar5 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  t_map *local_120;
  t_list *tlist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  t_map *local_d8;
  t_set *tset;
  string local_b0;
  undefined1 local_89;
  t_type *local_88;
  t_type *ktype;
  t_map *tmap;
  t_container *tcontainer;
  string local_68;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d [20];
  allocator local_29;
  t_base local_28;
  byte local_21;
  t_base tbase;
  bool isArg_local;
  t_type *ttype_local;
  t_d_generator *this_local;
  string *name;
  
  local_21 = isArg;
  _tbase = (t_map *)ttype;
  ttype_local = (t_type *)this;
  this_local = (t_d_generator *)__return_storage_ptr__;
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])();
  if ((uVar2 & 1) != 0) {
    local_28 = t_base_type::get_base((t_base_type *)_tbase);
    switch(local_28) {
    case TYPE_VOID:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"void",&local_29);
      std::allocator<char>::~allocator((allocator<char> *)&local_29);
      return __return_storage_ptr__;
    case TYPE_STRING:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"string",local_3d);
      std::allocator<char>::~allocator((allocator<char> *)local_3d);
      return __return_storage_ptr__;
    case TYPE_BOOL:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"bool",&local_3e);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e);
      return __return_storage_ptr__;
    case TYPE_I8:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"byte",&local_3f);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f);
      return __return_storage_ptr__;
    case TYPE_I16:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"short",&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_40);
      return __return_storage_ptr__;
    case TYPE_I32:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      return __return_storage_ptr__;
    case TYPE_I64:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"long",&local_42);
      std::allocator<char>::~allocator((allocator<char> *)&local_42);
      return __return_storage_ptr__;
    case TYPE_DOUBLE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"double",&local_43);
      std::allocator<char>::~allocator((allocator<char> *)&local_43);
      return __return_storage_ptr__;
    default:
      tcontainer._7_1_ = 1;
      auVar5 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_68,(t_base_type *)(ulong)local_28,auVar5._8_4_);
      std::operator+(auVar5._0_8_,"Compiler error: No D type name for base type ",&local_68);
      tcontainer._7_1_ = 0;
      __cxa_throw(auVar5._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  uVar2 = (*(_tbase->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xd])();
  if ((uVar2 & 1) != 0) {
    tmap = _tbase;
    bVar1 = t_container::has_cpp_name(&_tbase->super_t_container);
    if (bVar1) {
      t_container::get_cpp_name_abi_cxx11_(__return_storage_ptr__,&tmap->super_t_container);
      return __return_storage_ptr__;
    }
    uVar2 = (*(_tbase->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])();
    if ((uVar2 & 1) != 0) {
      ktype = (t_type *)_tbase;
      local_88 = t_map::get_key_type(_tbase);
      local_89 = 0;
      ptVar4 = t_map::get_val_type((t_map *)ktype);
      render_type_name_abi_cxx11_(&local_b0,this,ptVar4,false);
      std::operator+(__return_storage_ptr__,&local_b0,"[");
      std::__cxx11::string::~string((string *)&local_b0);
      bVar1 = is_immutable_type(this,local_88);
      if (!bVar1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"immutable(");
      }
      render_type_name_abi_cxx11_((string *)&tset,this,local_88,false);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&tset);
      std::__cxx11::string::~string((string *)&tset);
      bVar1 = is_immutable_type(this,local_88);
      if (!bVar1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
      return __return_storage_ptr__;
    }
    uVar2 = (*(_tbase->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])();
    if ((uVar2 & 1) != 0) {
      local_d8 = _tbase;
      ptVar4 = t_set::get_elem_type((t_set *)_tbase);
      render_type_name_abi_cxx11_((string *)&tlist,this,ptVar4,false);
      std::operator+(&local_f8,"HashSet!(",(string *)&tlist);
      std::operator+(__return_storage_ptr__,&local_f8,")");
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&tlist);
      return __return_storage_ptr__;
    }
    uVar2 = (*(_tbase->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])();
    if ((uVar2 & 1) != 0) {
      local_120 = _tbase;
      ptVar4 = t_list::get_elem_type((t_list *)_tbase);
      render_type_name_abi_cxx11_(&local_140,this,ptVar4,false);
      std::operator+(__return_storage_ptr__,&local_140,"[]");
      std::__cxx11::string::~string((string *)&local_140);
      return __return_storage_ptr__;
    }
  }
  uVar2 = (*(_tbase->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xb])();
  if (((uVar2 & 1) == 0) || ((local_21 & 1) == 0)) {
    iVar3 = (*(_tbase->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)CONCAT44(extraout_var_00,iVar3));
  }
  else {
    iVar3 = (*(_tbase->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_160,"ref const(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar3));
    std::operator+(__return_storage_ptr__,&local_160,")");
    std::__cxx11::string::~string((string *)&local_160);
  }
  return __return_storage_ptr__;
}

Assistant:

string render_type_name(const t_type* ttype, bool isArg = false) const {
    if (ttype->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        return "void";
      case t_base_type::TYPE_STRING:
        return "string";
      case t_base_type::TYPE_BOOL:
        return "bool";
      case t_base_type::TYPE_I8:
        return "byte";
      case t_base_type::TYPE_I16:
        return "short";
      case t_base_type::TYPE_I32:
        return "int";
      case t_base_type::TYPE_I64:
        return "long";
      case t_base_type::TYPE_DOUBLE:
        return "double";
      default:
        throw "Compiler error: No D type name for base type " + t_base_type::t_base_name(tbase);
      }
    }

    if (ttype->is_container()) {
      t_container* tcontainer = (t_container*)ttype;
      if (tcontainer->has_cpp_name()) {
        return tcontainer->get_cpp_name();
      } else if (ttype->is_map()) {
        t_map* tmap = (t_map*)ttype;
        t_type* ktype = tmap->get_key_type();

        string name = render_type_name(tmap->get_val_type()) + "[";
        if (!is_immutable_type(ktype)) {
          name += "immutable(";
        }
        name += render_type_name(ktype);
        if (!is_immutable_type(ktype)) {
          name += ")";
        }
        name += "]";
        return name;
      } else if (ttype->is_set()) {
        t_set* tset = (t_set*)ttype;
        return "HashSet!(" + render_type_name(tset->get_elem_type()) + ")";
      } else if (ttype->is_list()) {
        t_list* tlist = (t_list*)ttype;
        return render_type_name(tlist->get_elem_type()) + "[]";
      }
    }

    if (ttype->is_struct() && isArg) {
      return "ref const(" + ttype->get_name() + ")";
    } else {
      return ttype->get_name();
    }
  }